

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_list_column.h
# Opt level: O0

Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>
* __thiscall
Gudhi::persistence_matrix::
Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>
::operator*=(Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>
             *this,Field_element *val)

{
  invalid_argument *this_00;
  Field_element *val_local;
  Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>
  *this_local;
  
  if ((uint)(*val & 1) % 2 == 0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"A chain column should not be multiplied by 0.")
    ;
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  return this;
}

Assistant:

inline Intrusive_list_column<Master_matrix>& Intrusive_list_column<Master_matrix>::operator*=(const Field_element& val)
{
  if constexpr (Master_matrix::Option_list::is_z2) {
    if (val % 2 == 0) {
      if constexpr (Master_matrix::isNonBasic && !Master_matrix::Option_list::is_of_boundary_type) {
        throw std::invalid_argument("A chain column should not be multiplied by 0.");
      } else {
        clear();
      }
    }
  } else {
    Field_element realVal = operators_->get_value(val);

    if (realVal == Field_operators::get_additive_identity()) {
      if constexpr (Master_matrix::isNonBasic && !Master_matrix::Option_list::is_of_boundary_type) {
        throw std::invalid_argument("A chain column should not be multiplied by 0.");
      } else {
        clear();
      }
      return *this;
    }

    if (realVal == Field_operators::get_multiplicative_identity()) return *this;

    for (Entry& entry : column_) {
      operators_->multiply_inplace(entry.get_element(), realVal);
      if constexpr (Master_matrix::Option_list::has_row_access) RA_opt::update_entry(entry);
    }
  }

  return *this;
}